

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnEndExpr(BinaryReaderInterp *this)

{
  pointer *ppLVar1;
  LabelType LVar2;
  pointer pLVar3;
  Result RVar4;
  Enum EVar5;
  Label *label;
  Label *local_20;
  
  RVar4 = TypeChecker::GetLabel(&(this->validator_).typechecker_,0,&local_20);
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
    LVar2 = local_20->label_type;
    RVar4 = SharedValidator::OnEnd
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc)
    ;
    if (RVar4.enum_ != Error) {
      if (LVar2 - If < 2) {
        pLVar3 = (this->label_stack_).
                 super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pLVar3 == (this->label_stack_).
                      super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          __assert_fail("depth < label_stack_.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/binary-reader-interp.cc"
                        ,0x14f,
                        "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                       );
        }
        Istream::ResolveFixupU32(this->istream_,pLVar3[-1].fixup_offset);
      }
      FixupMap::Resolve(&this->depth_fixups_,this->istream_,
                        (int)((ulong)((long)(this->label_stack_).
                                            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->label_stack_).
                                           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      ppLVar1 = &(this->label_stack_).
                 super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + -1;
      EVar5 = Ok;
    }
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderInterp::OnEndExpr() {
  SharedValidator::Label* label;
  CHECK_RESULT(validator_.GetLabel(0, &label));
  LabelType label_type = label->label_type;
  CHECK_RESULT(validator_.OnEnd(loc));
  if (label_type == LabelType::If || label_type == LabelType::Else) {
    istream_.ResolveFixupU32(TopLabel()->fixup_offset);
  }
  FixupTopLabel();
  PopLabel();
  return Result::Ok;
}